

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

void Abc_ZddPermTestInt(Abc_ZddMan *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int pComb [5];
  int pPerms [3] [5];
  uint local_98 [8];
  int local_78 [18];
  
  local_78[0xc] = 2;
  local_78[0xd] = 1;
  local_78[0xe] = 4;
  local_78[8] = 0;
  local_78[9] = 3;
  local_78[10] = 0;
  local_78[0xb] = 3;
  local_78[4] = 3;
  local_78[5] = 1;
  local_78[6] = 2;
  local_78[7] = 4;
  local_78[0] = 1;
  local_78[1] = 0;
  local_78[2] = 2;
  local_78[3] = 4;
  lVar7 = 0;
  do {
    Abc_ZddPermPrint((int *)((long)local_78 + lVar7),5);
    lVar7 = lVar7 + 0x14;
  } while (lVar7 != 0x3c);
  uVar6 = 0;
  iVar2 = 0;
  do {
    printf("Perm %d:\n",uVar6 & 0xffffffff);
    Abc_ZddPermPrint(local_78 + uVar6 * 5,5);
    uVar1 = Abc_ZddPerm2Comb(local_78 + uVar6 * 5,5,(int *)local_98);
    Abc_ZddCombPrint((int *)local_98,uVar1);
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        uVar5 = local_98[uVar3] & 0xffff;
        iVar4 = (int)local_98[uVar3] >> 0x10;
        if ((int)uVar5 <= iVar4) {
          __assert_fail("i < j",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilPerm.c"
                        ,0x65,"int Abc_ZddVarIJ(Abc_ZddMan *, int, int)");
        }
        local_98[uVar3] = p->pT2V[(int)(iVar4 * p->nPermSize + uVar5)];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    Abc_ZddPermPrint((int *)local_98,uVar1);
    iVar4 = Abc_ZddBuildSet(p,(int *)local_98,uVar1);
    iVar2 = Abc_ZddUnion(p,iVar2,iVar4);
    uVar6 = uVar6 + 1;
  } while (uVar6 != 3);
  puts("\nResulting set of permutations:");
  Abc_ZddPrint(p,iVar2);
  uVar1 = Abc_ZddCount_rec(p,iVar2);
  Abc_ZddUnmark_rec(p,iVar2);
  uVar5 = Abc_ZddCountPaths(p,iVar2);
  printf("Nodes = %d.   Path = %d.\n",(ulong)uVar1,(ulong)uVar5);
  iVar2 = Abc_ZddPerm(p,iVar2,p->pT2V[(long)p->nPermSize * 3 + 4]);
  puts("\nResulting set of permutations:");
  Abc_ZddPrint(p,iVar2);
  uVar1 = Abc_ZddCount_rec(p,iVar2);
  Abc_ZddUnmark_rec(p,iVar2);
  uVar5 = Abc_ZddCountPaths(p,iVar2);
  printf("Nodes = %d.   Path = %d.\n",(ulong)uVar1,(ulong)uVar5);
  putchar(10);
  return;
}

Assistant:

void Abc_ZddPermTestInt( Abc_ZddMan * p )
{
    int nPerms = 3;
    int Size = 5;
    int pPerms[3][5] = { {1, 0, 2, 4, 3}, {1, 2, 4, 0, 3}, {0, 3, 2, 1, 4} };
    int pComb[5], nTrans;
    int i, k, Set, Union = 0, iPivot;
    for ( i = 0; i < nPerms; i++ )
        Abc_ZddPermPrint( pPerms[i], Size );
    for ( i = 0; i < nPerms; i++ )
    {
        printf( "Perm %d:\n", i );
        Abc_ZddPermPrint( pPerms[i], Size );
        nTrans = Abc_ZddPerm2Comb( pPerms[i], Size, pComb );
        Abc_ZddCombPrint( pComb, nTrans );
        for ( k = 0; k < nTrans; k++ )
            pComb[k] = Abc_ZddVarIJ( p, pComb[k] >> 16, pComb[k] & 0xFFFF );
        Abc_ZddPermPrint( pComb, nTrans );
        // add to ZDD
        Set = Abc_ZddBuildSet( p, pComb, nTrans );
        Union = Abc_ZddUnion( p, Union, Set );
    }
    printf( "\nResulting set of permutations:\n" );
    Abc_ZddPrint( p, Union );
    printf( "Nodes = %d.   Path = %d.\n", Abc_ZddCountNodes(p, Union), Abc_ZddCountPaths(p, Union) );

    iPivot = Abc_ZddVarIJ( p, 3, 4 );
    Union = Abc_ZddPerm( p, Union, iPivot );

    printf( "\nResulting set of permutations:\n" );
    Abc_ZddPrint( p, Union );
    printf( "Nodes = %d.   Path = %d.\n", Abc_ZddCountNodes(p, Union), Abc_ZddCountPaths(p, Union) );
    printf( "\n" );
}